

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

void UpdatePSBTOutput(SigningProvider *provider,PartiallySignedTransaction *psbt,int index)

{
  _Base_ptr p_Var1;
  pointer pPVar2;
  CMutableTransaction *tx;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pCVar6;
  PSBTOutput *this;
  long in_FS_OFFSET;
  MutableTransactionSignatureCreator creator;
  SignatureData sigdata;
  MutableTransactionSignatureCreator local_418;
  SignatureData local_3c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tx = (CMutableTransaction *)
       inline_assertion_check<true,std::optional<CMutableTransaction>&>
                 (&psbt->tx,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/psbt.cpp"
                  ,0x154,"UpdatePSBTOutput","psbt.tx");
  uVar5 = (ulong)index;
  pCVar6 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pCVar6 >> 3) * -0x3333333333333333;
  if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
    pPVar2 = (psbt->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = ((long)(psbt->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 3) *
            0x6f96f96f96f96f97;
    if (uVar5 <= uVar4 && uVar4 - uVar5 != 0) {
      this = pPVar2 + uVar5;
      local_3c8.complete = false;
      local_3c8.witness = false;
      p_Var1 = &local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      memset(&local_3c8.scriptSig,0,0xb8);
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
      super__Optional_payload<TaprootBuilder,_true,_false,_false>.
      super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.taproot_key_path_sig.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3c8.taproot_key_path_sig.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c8.taproot_key_path_sig.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
      local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
      local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var1;
      local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var1;
      local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      PSBTOutput::FillSignatureData(this,&local_3c8);
      pCVar6 = pCVar6 + uVar5;
      MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                (&local_418,tx,0,&pCVar6->nValue,1);
      ProduceSignature(provider,&local_418.super_BaseSignatureCreator,&pCVar6->scriptPubKey,
                       &local_3c8);
      PSBTOutput::FromSignatureData(this,&local_3c8);
      SignatureData::~SignatureData(&local_3c8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_003627c0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar3 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar5);
    SignatureData::~SignatureData(&local_3c8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar3);
    }
  }
LAB_003627c0:
  __stack_chk_fail();
}

Assistant:

void UpdatePSBTOutput(const SigningProvider& provider, PartiallySignedTransaction& psbt, int index)
{
    CMutableTransaction& tx = *Assert(psbt.tx);
    const CTxOut& out = tx.vout.at(index);
    PSBTOutput& psbt_out = psbt.outputs.at(index);

    // Fill a SignatureData with output info
    SignatureData sigdata;
    psbt_out.FillSignatureData(sigdata);

    // Construct a would-be spend of this output, to update sigdata with.
    // Note that ProduceSignature is used to fill in metadata (not actual signatures),
    // so provider does not need to provide any private keys (it can be a HidingSigningProvider).
    MutableTransactionSignatureCreator creator(tx, /*input_idx=*/0, out.nValue, SIGHASH_ALL);
    ProduceSignature(provider, creator, out.scriptPubKey, sigdata);

    // Put redeem_script, witness_script, key paths, into PSBTOutput.
    psbt_out.FromSignatureData(sigdata);
}